

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexthtmlparser.cpp
# Opt level: O0

void __thiscall QTextHtmlParser::parse(QTextHtmlParser *this)

{
  bool bVar1;
  QString *in_RDI;
  long in_FS_OFFSET;
  QChar c;
  QList<QTextHtmlParserNode_*> *in_stack_ffffffffffffffb8;
  QString *this_00;
  QTextHtmlParser *in_stack_ffffffffffffffe8;
  QChar local_e;
  QChar local_c;
  char16_t local_a;
  QTextHtmlParser *this_01;
  
  this_01 = *(QTextHtmlParser **)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  while (*(int *)&in_RDI[2].d.d < *(int *)((long)&in_RDI[2].d.d + 4)) {
    local_a = 0xaaaa;
    *(int *)&in_RDI[2].d.d = *(int *)&in_RDI[2].d.d + 1;
    local_a = (char16_t)QString::at(this_00,(qsizetype)in_RDI);
    QChar::QChar<char16_t,_true>(&local_c,L'<');
    bVar1 = ::operator==((QChar *)in_RDI,(QChar *)in_stack_ffffffffffffffb8);
    if (bVar1) {
      parseTag(this_01);
    }
    else {
      QChar::QChar<char16_t,_true>(&local_e,L'&');
      bVar1 = ::operator==((QChar *)in_RDI,(QChar *)in_stack_ffffffffffffffb8);
      if (bVar1) {
        parseEntity(in_stack_ffffffffffffffe8);
        QList<QTextHtmlParserNode_*>::last(in_stack_ffffffffffffffb8);
        QString::operator+=(in_RDI,(QString *)in_stack_ffffffffffffffb8);
        QString::~QString((QString *)0x859f61);
      }
      else {
        QList<QTextHtmlParserNode_*>::last(in_stack_ffffffffffffffb8);
        QString::operator+=(in_RDI,(QChar)(char16_t)((ulong)this_00 >> 0x30));
      }
    }
  }
  if (*(QTextHtmlParser **)(in_FS_OFFSET + 0x28) != this_01) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextHtmlParser::parse()
{
    while (pos < len) {
        QChar c = txt.at(pos++);
        if (c == u'<') {
            parseTag();
        } else if (c == u'&') {
            nodes.last()->text += parseEntity();
        } else {
            nodes.last()->text += c;
        }
    }
}